

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O3

void __thiscall Qclass::createGrid(Qclass *this)

{
  int *piVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  long local_218;
  ofstream outfile;
  uint auStack_200 [56];
  ios_base local_120 [264];
  
  piVar1 = this->grid[0x1e] + 0x28;
  lVar3 = 0x1e;
  do {
    lVar4 = 0;
    do {
      piVar1[lVar4] = 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    lVar3 = lVar3 + 1;
    piVar1 = piVar1 + 0x32;
  } while (lVar3 != 0x2e);
  piVar1 = this->grid[10] + 10;
  lVar3 = 10;
  do {
    lVar4 = 0;
    do {
      piVar1[lVar4] = 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x15);
    lVar3 = lVar3 + 1;
    piVar1 = piVar1 + 0x32;
  } while (lVar3 != 0x15);
  std::ofstream::ofstream((ostream *)&local_218);
  std::ofstream::open((char *)&local_218,0x144170);
  *(undefined8 *)(&outfile + *(long *)(local_218 + -0x18)) = 6;
  *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_218,0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)poVar2,0x28);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_218,0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)poVar2,0x2d);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_218,0x2d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)poVar2,0x2d);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_218,0x2d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)poVar2,0x28);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_218,0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)poVar2,0x28);
  std::ofstream::close();
  std::ofstream::open((char *)&local_218,0x1445e1);
  *(undefined8 *)(&outfile + *(long *)(local_218 + -0x18)) = 6;
  *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_218,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)poVar2,10);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_218,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)poVar2,0x1e);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_218,0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)poVar2,0x1e);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_218,0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)poVar2,10);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_218,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)poVar2,10);
  std::ofstream::close();
  local_218 = _VTT;
  *(undefined8 *)((long)&local_218 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&outfile);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void Qclass::createGrid() {
  for (int i = 30; i < 46; i++) {
    for (int j = 40; j < 46; j++) {
      grid[i][j] = 1;
    }
  }
  for (int i = 10; i < 21; i++) {
    for (int j = 10; j < 31; j++) {
      grid[i][j] = 1;
    }
  }
  std::ofstream outfile;
  outfile.open("Obstacles1.txt", std::ios::out | std::ios::trunc);
  outfile.precision(6);
  outfile << std::fixed << 30 << "   " << std::fixed << 40;
  outfile << std::endl;
  outfile << std::fixed << 30 << "   " << std::fixed << 45;
  outfile << std::endl;
  outfile << std::fixed << 45 << "   " << std::fixed << 45;
  outfile << std::endl;
  outfile << std::fixed << 45 << "   " << std::fixed << 40;
  outfile << std::endl;
  outfile << std::fixed << 30 << "   " << std::fixed << 40;
  outfile.close();
  outfile.open("Obstacles2.txt", std::ios::out | std::ios::trunc);
  outfile.precision(6);
  outfile << std::fixed << 10 << "   " << std::fixed << 10;
  outfile << std::endl;
  outfile << std::fixed << 10 << "   " << std::fixed << 30;
  outfile << std::endl;
  outfile << std::fixed << 20 << "   " << std::fixed << 30;
  outfile << std::endl;
  outfile << std::fixed << 20 << "   " << std::fixed << 10;
  outfile << std::endl;
  outfile << std::fixed << 10 << "   " << std::fixed << 10;
  outfile.close();
}